

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyHashRelease(SyHash *pHash)

{
  sxu32 *psVar1;
  SyHashEntry_Pr *pSVar2;
  SyHashEntry_Pr *pChunk;
  
  if (pHash->nEntry != 0) {
    pChunk = pHash->pList;
    do {
      pSVar2 = pChunk->pNext;
      SyMemBackendPoolFree(pHash->pAllocator,pChunk);
      psVar1 = &pHash->nEntry;
      *psVar1 = *psVar1 - 1;
      pChunk = pSVar2;
    } while (*psVar1 != 0);
  }
  if (pHash->apBucket != (SyHashEntry_Pr **)0x0) {
    SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
  }
  pHash->apBucket = (SyHashEntry_Pr **)0x0;
  pHash->nBucketSize = 0;
  pHash->pAllocator = (SyMemBackend *)0x0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyHashRelease(SyHash *pHash)
{
	SyHashEntry_Pr *pEntry, *pNext;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash)  ){
		return SXERR_EMPTY;
	}
#endif
	pEntry = pHash->pList;
	for(;;){
		if( pHash->nEntry == 0 ){
			break;
		}
		pNext = pEntry->pNext;
		SyMemBackendPoolFree(pHash->pAllocator, pEntry);
		pEntry = pNext;
		pHash->nEntry--;
	}
	if( pHash->apBucket ){
		SyMemBackendFree(pHash->pAllocator, (void *)pHash->apBucket);
	}
	pHash->apBucket = 0;
	pHash->nBucketSize = 0;
	pHash->pAllocator = 0;
	return SXRET_OK;
}